

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

Maybe<unsigned_int> __thiscall
kj::parse::Many_<kj::parse::Exactly_<char>,_false>::
Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_>::apply
          (Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_> *this,
          Exactly_<char> *subParser,IteratorInput<char,_const_char_*> *input)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (input->pos == input->end) {
    iVar2 = 0;
  }
  else {
    cVar1 = subParser->expected;
    pcVar3 = input->best;
    iVar2 = 0;
    pcVar4 = input->pos;
    do {
      pcVar5 = pcVar4 + (*pcVar4 == cVar1);
      if (*pcVar4 != cVar1) {
        if (pcVar4 < pcVar5) {
          pcVar4 = pcVar5;
        }
        if (pcVar4 <= pcVar3) {
          pcVar4 = pcVar3;
        }
        input->best = pcVar4;
        break;
      }
      iVar2 = iVar2 + 1;
      if (pcVar4 < pcVar5) {
        pcVar4 = pcVar5;
      }
      if (pcVar3 < pcVar4) {
        pcVar3 = pcVar4;
      }
      input->pos = pcVar5;
      input->best = pcVar3;
      pcVar4 = pcVar5;
    } while (pcVar5 != input->end);
  }
  *this = (Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_>)0x1;
  *(int *)(this + 4) = iVar2;
  return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
}

Assistant:

static Maybe<uint> apply(const SubParser& subParser, Input& input) {
    uint count = 0;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        ++count;
      } else {
        break;
      }
    }